

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_context_enumerate_devices__jack
                    (ma_context *pContext,ma_enum_devices_callback_proc callback,void *pUserData)

{
  ma_bool32 mVar1;
  size_t i;
  long lVar2;
  ma_device_info deviceInfo;
  ma_device_info local_250;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x50bd,
                  "ma_result ma_context_enumerate_devices__jack(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  if (callback != (ma_enum_devices_callback_proc)0x0) {
    lVar2 = 0;
    memset(&local_250,0,0x230);
    do {
      local_250.name[lVar2] = "Default Playback Device"[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x17);
    local_250.name[0x17] = '\0';
    mVar1 = (*callback)(pContext,ma_device_type_playback,&local_250,pUserData);
    if (mVar1 != 0) {
      lVar2 = 0;
      memset(&local_250,0,0x230);
      do {
        local_250.name[lVar2] = "Default Capture Device"[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x16);
      local_250.name[0x16] = '\0';
      (*callback)(pContext,ma_device_type_capture,&local_250,pUserData);
    }
    return 0;
  }
  __assert_fail("callback != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x50be,
                "ma_result ma_context_enumerate_devices__jack(ma_context *, ma_enum_devices_callback_proc, void *)"
               );
}

Assistant:

static ma_result ma_context_enumerate_devices__jack(ma_context* pContext, ma_enum_devices_callback_proc callback, void* pUserData)
{
    ma_bool32 cbResult = MA_TRUE;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(callback != NULL);

    /* Playback. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), MA_DEFAULT_PLAYBACK_DEVICE_NAME, (size_t)-1);
        cbResult = callback(pContext, ma_device_type_playback, &deviceInfo, pUserData);
    }

    /* Capture. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), MA_DEFAULT_CAPTURE_DEVICE_NAME, (size_t)-1);
        cbResult = callback(pContext, ma_device_type_capture, &deviceInfo, pUserData);
    }

    return MA_SUCCESS;
}